

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

_Bool art_iterator_up(art_iterator_t *iterator)

{
  uint8_t uVar1;
  
  uVar1 = iterator->frame;
  if (uVar1 != '\0') {
    iterator->frame = uVar1 - 1;
    iterator->depth = iterator->depth + ~(byte)iterator->frames[(byte)(uVar1 - 1)].node[1];
  }
  return uVar1 != '\0';
}

Assistant:

static bool art_iterator_up(art_iterator_t *iterator) {
    if (iterator->frame == 0) {
        return false;
    }
    iterator->frame--;
    // We went up, so we are at an inner node.
    iterator->depth -=
        ((art_inner_node_t *)art_iterator_node(iterator))->prefix_size + 1;
    return true;
}